

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_3000_3999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case3503(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  socklen_t __len;
  allocator_type *__a;
  initializer_list<int> __l;
  allocator_type local_373;
  allocator<char> local_372;
  allocator<char> local_371;
  _Vector_base<int,_std::allocator<int>_> local_370;
  string local_358;
  string local_338 [32];
  int local_318 [2];
  Expectation local_310;
  Expectation local_258;
  Decl local_1a0;
  Decl local_d8;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_338,"void f() { { } { int x ; } }",&local_371);
  Expectation::Expectation(&local_310);
  Decl::Decl(&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"x",&local_372);
  pDVar1 = Decl::Object(&local_1a0,&local_358,VariableDeclaration,Block);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  Decl::Decl(&local_d8,pDVar1);
  pEVar2 = Expectation::declaration(&local_310,&local_d8);
  local_318[0] = 0;
  local_318[1] = 1;
  __a = &local_373;
  __l._M_len = 2;
  __l._M_array = local_318;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_370,__l,__a);
  __len = (socklen_t)__a;
  pEVar2 = Expectation::scopePath(pEVar2,(vector<int,_std::allocator<int>_> *)&local_370);
  Expectation::Expectation(&local_258,pEVar2);
  bind(this,(int)local_338,(sockaddr *)&local_258,__len);
  Expectation::~Expectation(&local_258);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_370);
  Decl::~Decl(&local_d8);
  std::__cxx11::string::~string((string *)&local_358);
  Decl::~Decl(&local_1a0);
  Expectation::~Expectation(&local_310);
  std::__cxx11::string::~string(local_338);
  return;
}

Assistant:

void DeclarationBinderTester::case3503()
{
    bind("void f() { { } { int x ; } }",
         Expectation()
            .declaration(Decl()
                     .Object("x", SymbolKind::VariableDeclaration, ScopeKind::Block)
                     .ty_.Basic(BasicTypeKind::Int_S))
            .scopePath({0, 1}));
}